

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::we_have(torrent *this,piece_index_t index,bool loading_resume)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  time_point32 tVar4;
  reference this_00;
  vector<peer_connection_*> *pvVar5;
  element_type *peVar6;
  __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01
  ;
  element_type *peVar7;
  reference pppVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *this_02;
  file_storage *fs;
  bool local_141;
  anon_class_8_1_8991fb9c local_130;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)>
  local_128;
  piece_index_t local_104;
  undefined1 local_100 [32];
  peer_connection *p_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<peer_connection_*> *__range2_2;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2_1;
  undefined1 local_80 [8];
  shared_ptr<libtorrent::aux::peer_connection> p;
  peer_connection *c;
  iterator __end2;
  iterator __begin2;
  vector<peer_connection_*> *__range2;
  const_iterator local_48;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_40;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_38;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_30;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  local_28;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  it;
  bool announce_piece;
  bool loading_resume_local;
  torrent *this_local;
  piece_index_t index_local;
  
  it._M_current._7_1_ = loading_resume;
  this_local._4_4_ = index.m_val;
  inc_stats_counter(this,0x6d,1);
  it._M_current._6_1_ = 1;
  local_30._M_current =
       (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
       ::std::
       vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ::begin(&this->m_predictive_pieces);
  local_38 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
             ::std::
             vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ::end(&this->m_predictive_pieces);
  local_28 = ::std::
             lower_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                       (local_30,(__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                  )local_38,
                        (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                        ((long)&this_local + 4));
  local_40._M_current =
       (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
       ::std::
       vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ::end(&this->m_predictive_pieces);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
  local_141 = false;
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
              ::operator*(&local_28);
    local_141 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                          (this_00,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                   ((long)&this_local + 4));
  }
  if (local_141 != false) {
    it._M_current._6_1_ = 0;
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
    ::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
              ((__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>
                *)&local_48,&local_28);
    ::std::
    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ::erase(&this->m_predictive_pieces,local_48);
  }
  pvVar5 = &(this->super_torrent_hot_members).m_connections;
  __end2 = ::std::
           vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ::begin(&pvVar5->
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  );
  c = (peer_connection *)
      ::std::
      vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ::end(&pvVar5->
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                     *)&c), bVar1) {
    pppVar8 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator*(&__end2);
    p.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pppVar8;
    peer_connection::self((peer_connection *)local_80);
    peVar6 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
    peer_connection::received_piece(peVar6,this_local._4_4_);
    peVar6 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
    uVar2 = (*(peVar6->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
    if ((uVar2 & 1) == 0) {
      if ((it._M_current._6_1_ & 1) == 0) {
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_80);
        peer_connection::fill_send_buffer(peVar6);
      }
      else {
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_80);
        peer_connection::announce_piece(peVar6,this_local._4_4_);
      }
    }
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)local_80);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = ::std::__cxx11::
             list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
             ::begin(&this->m_extensions);
  ext = (shared_ptr<libtorrent::torrent_plugin> *)
        ::std::__cxx11::
        list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
        ::end(&this->m_extensions);
  while (bVar1 = ::std::operator!=(&__end2_1,(_Self *)&ext), bVar1) {
    this_01 = (__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*
                           (&__end2_1);
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    (*peVar7->_vptr_torrent_plugin[3])(peVar7,(ulong)(uint)this_local._4_4_);
    ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2_1);
  }
  pvVar5 = &(this->super_torrent_hot_members).m_connections;
  __end2_2 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin(&pvVar5->
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    );
  p_1 = (peer_connection *)
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::end(&pvVar5->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                             *)&p_1), bVar1) {
    pppVar8 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator*(&__end2_2);
    local_100._24_8_ = *pppVar8;
    bVar1 = peer_connection::is_interesting((peer_connection *)local_100._24_8_);
    if (bVar1) {
      local_100._20_4_ = this_local._4_4_;
      bVar1 = peer_connection::has_piece((peer_connection *)local_100._24_8_,this_local._4_4_);
      if (bVar1) {
        peer_connection::update_interest((peer_connection *)local_100._24_8_);
      }
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::operator++(&__end2_2);
  }
  if ((it._M_current._7_1_ & 1) == 0) {
    local_100[0x13] = '\x10';
    set_need_save_resume(this,(resume_data_flags_t)0x10);
    state_updated(this);
    update_want_tick(this);
  }
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  bVar1 = alert_manager::should_post<libtorrent::piece_finished_alert>
                    ((alert_manager *)CONCAT44(extraout_var,iVar3));
  if (bVar1) {
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_100);
    alert_manager::
    emplace_alert<libtorrent::piece_finished_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar3),(torrent_handle *)local_100,
               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ((long)&this_local + 4));
    torrent_handle::~torrent_handle((torrent_handle *)local_100);
  }
  this_02 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  fs = torrent_info::files(this_02);
  local_104.m_val = this_local._4_4_;
  local_130.this = this;
  ::std::function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)>::
  function<libtorrent::aux::torrent::we_have(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,bool)::__0,void>
            ((function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>)>
              *)&local_128,&local_130);
  aux::file_progress::update(&this->m_file_progress,fs,local_104,&local_128);
  ::std::
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)>::
  ~function(&local_128);
  remove_time_critical_piece(this,this_local._4_4_,true);
  bVar1 = anon_unknown_135::is_downloading_state
                    ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                           0x39) & 7);
  if (bVar1) {
    if (((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
          != 4) &&
        (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
         != 5)) && (bVar1 = is_finished(this), bVar1)) {
      finished(this);
    }
    tVar4 = time_now32();
    (this->m_last_download).__d.__r = (rep_conflict)tVar4.__d.__r;
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d & 1) != 0) {
      recalc_share_mode(this);
    }
  }
  update_want_tick(this);
  return;
}

Assistant:

void torrent::we_have(piece_index_t const index, bool const loading_resume)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(!has_picker() || m_picker->has_piece_passed(index));

		inc_stats_counter(counters::num_have_pieces);

		// at this point, we have the piece for sure. It has been
		// successfully written to disk. We may announce it to peers
		// (unless it has already been announced through predictive_piece_announce
		// feature).
		bool announce_piece = true;
#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		auto const it = std::lower_bound(m_predictive_pieces.begin()
			, m_predictive_pieces.end(), index);
		if (it != m_predictive_pieces.end() && *it == index)
		{
			// this means we've already announced the piece
			announce_piece = false;
			m_predictive_pieces.erase(it);
		}
#endif

		// make a copy of the peer list since peers
		// may disconnect while looping
		for (auto* c : m_connections)
		{
			auto p = c->self();

			// received_piece will check to see if we're still interested
			// in this peer, and if neither of us is interested in the other,
			// disconnect it.
			p->received_piece(index);
			if (p->is_disconnecting()) continue;

			// if we're not announcing the piece, it means we
			// already have, and that we might have received
			// a request for it, and not sending it because
			// we were waiting to receive the piece, now that
			// we have received it, try to send stuff (fill_send_buffer)
			if (announce_piece) p->announce_piece(index);
			else p->fill_send_buffer();
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			ext->on_piece_pass(index);
		}
#endif

		// since this piece just passed, we might have
		// become uninterested in some peers where this
		// was the last piece we were interested in
		// update_interest may disconnect the peer and
		// invalidate the iterator
		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			// if we're not interested already, no need to check
			if (!p->is_interesting()) continue;
			// if the peer doesn't have the piece we just got, it
			// shouldn't affect our interest
			if (!p->has_piece(index)) continue;
			p->update_interest();
		}

		if (!loading_resume)
		{
			set_need_save_resume(torrent_handle::if_download_progress);
			state_updated();
			update_want_tick();
		}

		if (m_ses.alerts().should_post<piece_finished_alert>())
			m_ses.alerts().emplace_alert<piece_finished_alert>(get_handle(), index);

		// update m_file_progress (if we have one)
		m_file_progress.update(m_torrent_file->files(), index
			, [this](file_index_t const file_index)
			{
				if (m_ses.alerts().should_post<file_completed_alert>())
				{
					// this file just completed, post alert
					m_ses.alerts().emplace_alert<file_completed_alert>(
						get_handle(), file_index);
				}
			});

#ifndef TORRENT_DISABLE_STREAMING
		remove_time_critical_piece(index, true);
#endif

		if (is_downloading_state(m_state))
		{
			if (m_state != torrent_status::finished
				&& m_state != torrent_status::seeding
				&& is_finished())
			{
				// torrent finished
				// i.e. all the pieces we're interested in have
				// been downloaded. Release the files (they will open
				// in read only mode if needed)
				finished();
				// if we just became a seed, picker is now invalid, since it
				// is deallocated by the torrent once it starts seeding
			}

			m_last_download = aux::time_now32();

#ifndef TORRENT_DISABLE_SHARE_MODE
			if (m_share_mode)
				recalc_share_mode();
#endif
		}
		update_want_tick();
	}